

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringElement.cpp
# Opt level: O0

ssize_t __thiscall StringElement::read(StringElement *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 uVar1;
  undefined4 in_register_00000034;
  string local_38 [8];
  string tmpStr;
  stringstream *f_local;
  StringElement *this_local;
  
  tmpStr.field_2._8_8_ = CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::string(local_38);
  std::operator>>((istream *)tmpStr.field_2._8_8_,local_38);
  std::__cxx11::string::operator=((string *)&this->_value,local_38);
  Object::setInitState(&(this->super_StreamObject).super_Object,true);
  uVar1 = std::__cxx11::string::~string(local_38);
  return CONCAT71((int7)((ulong)uVar1 >> 8),1);
}

Assistant:

bool StringElement::read( std::stringstream &f )
{
	/*-----------------------------------------
		   Read string
	------------------------------------------*/

	std::string tmpStr;

	f >> tmpStr;

	_value = tmpStr;

	setInitState( true );

	return true;

}